

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.hpp
# Opt level: O2

void __thiscall Excel::Formula::Formula(Formula *this)

{
  this->m_valueType = UnknownValue;
  this->m_doubleValue = 0.0;
  this->m_errorValue = UnknownError;
  this->m_boolValue = false;
  (this->m_stringValue)._M_dataplus._M_p = (pointer)&(this->m_stringValue).field_2;
  (this->m_stringValue)._M_string_length = 0;
  (this->m_stringValue).field_2._M_local_buf[0] = L'\0';
  this->m_row = 0;
  this->m_column = 0;
  return;
}

Assistant:

inline
Formula::Formula()
	:	m_valueType( UnknownValue )
	,	m_doubleValue( 0.0 )
	,	m_errorValue( UnknownError )
	,	m_boolValue( false )
	,	m_row( 0 )
	,	m_column( 0 )
{
}